

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void httplib::detail::split(char *b,char *e,char d,function<void_(const_char_*,_const_char_*)> *fn)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  char *local_40;
  char *local_38;
  
  uVar2 = 0;
  uVar4 = 0;
  while( true ) {
    if (e == (char *)0x0) {
      bVar5 = b[uVar4] != '\0';
    }
    else {
      bVar5 = b + uVar4 < e;
    }
    if (!bVar5) break;
    uVar3 = uVar2;
    if (b[uVar4] == d) {
      for (; (b + uVar3 < e && ((b[uVar3] == ' ' || (uVar2 = uVar3, b[uVar3] == '\t'))));
          uVar3 = uVar3 + 1) {
        uVar2 = (long)e - (long)b;
      }
      uVar3 = uVar4;
      if (uVar4 != 0) {
        do {
          if ((b[uVar3 - 1] != ' ') && (b[uVar3 - 1] != '\t')) goto LAB_00152702;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
        uVar3 = 0;
      }
LAB_00152702:
      if (uVar2 < uVar3) {
        local_38 = b + uVar2;
        local_40 = b + uVar3;
        if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001527c7;
        (*fn->_M_invoker)((_Any_data *)fn,&local_38,&local_40);
      }
      uVar2 = uVar4 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  if (uVar4 != 0) {
    uVar3 = uVar2;
    if (b + uVar2 < e) {
      do {
        if ((b[uVar2] != ' ') && (uVar3 = uVar2, b[uVar2] != '\t')) break;
        lVar1 = uVar2 + 1;
        uVar2 = uVar2 + 1;
        uVar3 = (long)e - (long)b;
      } while (b + lVar1 < e);
    }
    do {
      if ((b[uVar4 - 1] != ' ') && (b[uVar4 - 1] != '\t')) goto LAB_0015278c;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar4 = 0;
LAB_0015278c:
    if (uVar3 < uVar4) {
      local_38 = b + uVar3;
      local_40 = b + uVar4;
      if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001527c7:
        std::__throw_bad_function_call();
      }
      (*fn->_M_invoker)((_Any_data *)fn,&local_38,&local_40);
    }
  }
  return;
}

Assistant:

inline void split(const char *b, const char *e, char d,
                  std::function<void(const char *, const char *)> fn) {
  size_t i = 0;
  size_t beg = 0;

  while (e ? (b + i < e) : (b[i] != '\0')) {
    if (b[i] == d) {
      auto r = trim(b, e, beg, i);
      if (r.first < r.second) { fn(&b[r.first], &b[r.second]); }
      beg = i + 1;
    }
    i++;
  }

  if (i) {
    auto r = trim(b, e, beg, i);
    if (r.first < r.second) { fn(&b[r.first], &b[r.second]); }
  }
}